

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapper_2.cpp
# Opt level: O2

void __thiscall n_e_s::core::Mapper2::ppu_write_byte(Mapper2 *this,uint16_t addr,uint8_t byte)

{
  reference pvVar1;
  pair<int,_unsigned_short> pVar2;
  
  if (addr < 0x2000) {
    pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::at
                       (&this->chr_mem_,(ulong)addr);
    *pvVar1 = byte;
  }
  pVar2 = translate_nametable_addr(this,addr,(this->super_IRom).header_.flags_6 & Vertical);
  (this->nametables_)._M_elems[pVar2.first]._M_elems[(ulong)pVar2 >> 0x20 & 0xffff] = byte;
  return;
}

Assistant:

void Mapper2::ppu_write_byte(uint16_t addr, uint8_t byte) {
    if (addr <= kChrEnd) {
        chr_mem_.at(addr) = byte;
    }
    const auto [index, addr_mod] =
            translate_nametable_addr(addr, header().mirroring());
    nametables_[index][addr_mod] = byte;
}